

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O0

result_t benchmark_sum_dividers<short,std::vector<libdivide::divider<short,(libdivide::Branching)1>,std::allocator<libdivide::divider<short,(libdivide::Branching)1>>>>
                   (vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
                    *dividers,size_t iters)

{
  result_t rVar1;
  undefined8 uVar2;
  short *psVar3;
  size_t sVar4;
  duration<double,_std::ratio<1L,_1L>_> *this;
  long in_RSI;
  rep_conflict rVar5;
  duration<double,_std::ratio<1L,_1L>_> seconds;
  time_point t2;
  short numerator;
  size_t sum;
  time_point t1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffb0;
  duration<double,_std::ratio<1L,_1L>_> in_stack_ffffffffffffffb8;
  short local_36 [3];
  vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
  *dividers_00;
  long local_20;
  
  uVar2 = std::chrono::_V2::system_clock::now();
  dividers_00 = (vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
                 *)0x0;
  for (local_20 = in_RSI; local_20 != 0; local_20 = local_20 + -1) {
    local_36[1] = 2;
    local_36[0] = (short)local_20;
    psVar3 = std::max<short>(local_36 + 1,local_36);
    local_36[2] = *psVar3;
    sVar4 = sum_dividers<short,std::vector<libdivide::divider<short,(libdivide::Branching)1>,std::allocator<libdivide::divider<short,(libdivide::Branching)1>>>>
                      ((short)((ulong)uVar2 >> 0x30),dividers_00);
    dividers_00 = (vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
                   *)((long)&(dividers_00->
                             super__Vector_base<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + sVar4);
  }
  this = (duration<double,_std::ratio<1L,_1L>_> *)std::chrono::_V2::system_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffffb8.__r,in_stack_ffffffffffffffb0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (this,(duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffffb8.__r);
  rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffb8);
  rVar1.sum = (size_t)dividers_00;
  rVar1.duration = rVar5;
  return rVar1;
}

Assistant:

NOINLINE result_t benchmark_sum_dividers(const D& dividers, size_t iters) {
    auto t1 = std::chrono::system_clock::now();
    size_t sum = 0;

    for (; iters > 0; iters--) {
        // Unsigned branchfree divider cannot be 1
        T numerator = std::max((T)2, (T)iters);
        sum += sum_dividers(numerator, dividers);
    }

    auto t2 = std::chrono::system_clock::now();
    std::chrono::duration<double> seconds = t2 - t1;
    return result_t{seconds.count(), sum};
}